

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

void __thiscall
InstructionVMEvalContext::StackFrame::AssignRegister(StackFrame *this,uint id,VmConstant *constant)

{
  SmallArray<VmConstant_*,_32U> *this_00;
  uint index;
  VmConstant **ppVVar1;
  
  if (id != 0) {
    this_00 = &this->instructionValues;
    index = (this->instructionValues).count;
    if (index < id) {
      SmallArray<VmConstant_*,_32U>::resize(this_00,id + 0x20);
      ppVVar1 = SmallArray<VmConstant_*,_32U>::operator[](this_00,index);
      memset(ppVVar1,0,(ulong)((this->instructionValues).count - index) << 3);
    }
    ppVVar1 = SmallArray<VmConstant_*,_32U>::operator[](this_00,id - 1);
    *ppVVar1 = constant;
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x80,
                "void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned int, VmConstant *)"
               );
}

Assistant:

void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned id, VmConstant *constant)
{
	assert(id != 0);

	unsigned oldSize = instructionValues.size();
	unsigned newSize = id;

	if(newSize > oldSize)
	{
		instructionValues.resize(newSize + 32);

		memset(&instructionValues[oldSize], 0, (instructionValues.size() - oldSize) * sizeof(instructionValues[0]));
	}

	instructionValues[id - 1] = constant;
}